

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

bool __thiscall Js::JavascriptSet::TryAddToSimpleVarSet(JavascriptSet *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SetDataNode *pSVar4;
  Recycler *recycler;
  MapOrSetDataNode<void_*> *local_38;
  SetDataNode *node;
  Var simpleVar;
  
  if (this->kind != SimpleVarSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x17a,"(this->kind == SetKind::SimpleVarSet)",
                                "this->kind == SetKind::SimpleVarSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pSVar4 = (SetDataNode *)JavascriptConversion::TryCanonicalizeAsSimpleVar<false>(value);
  if (pSVar4 != (SetDataNode *)0x0) {
    node = pSVar4;
    bVar2 = JsUtil::
            BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)this->u,&node);
    if (!bVar2) {
      recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
      local_38 = MapOrSetDataList<void_*>::Append(&this->list,&node,recycler);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->u,&node,&local_38);
    }
  }
  return pSVar4 != (SetDataNode *)0x0;
}

Assistant:

bool
JavascriptSet::TryAddToSimpleVarSet(Var value)
{
    Assert(this->kind == SetKind::SimpleVarSet);
    Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(value);
    if (!simpleVar)
    {
        return false;
    }

    if (!this->u.simpleVarSet->ContainsKey(simpleVar))
    {
        SetDataNode* node = this->list.Append(simpleVar, this->GetRecycler());
        this->u.simpleVarSet->Add(simpleVar, node);
    }

    return true;
}